

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Range.hpp
# Opt level: O2

void __thiscall binlog::Range::throw_if_overflow(Range *this,size_t s)

{
  runtime_error *this_00;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (this->_begin + s <= this->_end) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_a0,s);
  std::operator+(&local_80,"Range overflow ",&local_a0);
  std::operator+(&local_60,&local_80," > ");
  std::__cxx11::to_string(&local_c0,(long)this->_end - (long)this->_begin);
  std::operator+(&local_40,&local_60,&local_c0);
  std::runtime_error::runtime_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void throw_if_overflow(std::size_t s) const
  {
    if (_begin + s > _end)
    {
      throw std::runtime_error(
        "Range overflow " + std::to_string(s) + " > "
                          + std::to_string(size())
      );
    }
  }